

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O2

void Cgt_ManConstructCare(Aig_Man_t *pNew,Aig_Man_t *pCare,Vec_Vec_t *vSuppsInv,Vec_Ptr_t *vLeaves)

{
  Vec_Int_t *p;
  int iVar1;
  uint uVar2;
  int i;
  Aig_Obj_t *pAVar3;
  void *pvVar4;
  int iVar5;
  Aig_Obj_t *pAVar6;
  
  Aig_ManIncrementTravId(pCare);
  for (iVar5 = 0; iVar1 = vLeaves->nSize, iVar5 < iVar1; iVar5 = iVar5 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vLeaves,iVar5);
    iVar1 = Aig_ObjCioId(pAVar3);
    pvVar4 = Vec_PtrEntry(pCare->vCis,iVar1);
    *(int *)((long)pvVar4 + 0x20) = pCare->nTravIds;
    *(anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 *)((long)pvVar4 + 0x28) = pAVar3->field_5;
  }
  iVar5 = 0;
  while( true ) {
    if (iVar1 <= iVar5) {
      return;
    }
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vLeaves,iVar5);
    uVar2 = Aig_ObjCioId(pAVar3);
    if (((int)uVar2 < 0) || (vSuppsInv->nSize <= (int)uVar2)) break;
    p = (Vec_Int_t *)vSuppsInv->pArray[uVar2];
    for (iVar1 = 0; iVar1 < p->nSize; iVar1 = iVar1 + 1) {
      i = Vec_IntEntry(p,iVar1);
      pAVar3 = Aig_ManCo(pCare,i);
      if (pAVar3->TravId != pCare->nTravIds) {
        pAVar3->TravId = pCare->nTravIds;
        pAVar6 = (Aig_Obj_t *)((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe);
        if (pCare->pConst1 != pAVar6) {
          pAVar6 = Cgt_ManConstructCare_rec(pCare,pAVar6,pNew);
          if (pAVar6 != (Aig_Obj_t *)0x0) {
            Aig_ObjCreateCo(pNew,(Aig_Obj_t *)((ulong)((uint)pAVar3->pFanin0 & 1) ^ (ulong)pAVar6));
          }
        }
      }
    }
    iVar5 = iVar5 + 1;
    iVar1 = vLeaves->nSize;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
}

Assistant:

void Cgt_ManConstructCare( Aig_Man_t * pNew, Aig_Man_t * pCare, Vec_Vec_t * vSuppsInv, Vec_Ptr_t * vLeaves )
{
    Vec_Int_t * vOuts;
    Aig_Obj_t * pLeaf, * pPi, * pPo, * pObjAig;
    int i, k, iOut;
    // go through the PIs of the partition
    // label the corresponding PIs of the care set
    Aig_ManIncrementTravId( pCare );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pLeaf, i )
    {
        pPi = Aig_ManCi( pCare, Aig_ObjCioId(pLeaf) );
        Aig_ObjSetTravIdCurrent( pCare, pPi );
        pPi->pData = pLeaf->pData;
    }
    // construct the constraints
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pLeaf, i )
    {
        vOuts = Vec_VecEntryInt( vSuppsInv, Aig_ObjCioId(pLeaf) );
        Vec_IntForEachEntry( vOuts, iOut, k )
        {
            pPo = Aig_ManCo( pCare, iOut );
            if ( Aig_ObjIsTravIdCurrent( pCare, pPo ) )
                continue;
            Aig_ObjSetTravIdCurrent( pCare, pPo );
            if ( Aig_ObjFanin0(pPo) == Aig_ManConst1(pCare) )
                continue;
            pObjAig = Cgt_ManConstructCare_rec( pCare, Aig_ObjFanin0(pPo), pNew );
            if ( pObjAig == NULL )
                continue;
            pObjAig = Aig_NotCond( pObjAig, Aig_ObjFaninC0(pPo) );
            Aig_ObjCreateCo( pNew, pObjAig );
        }
    }
}